

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.hpp
# Opt level: O2

string * strfmt<std::__cxx11::string>
                   (string *__return_storage_ptr__,char *format,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  stringstream ss;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  printfmt<std::__cxx11::string>(local_190,format,args);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

inline std::string strfmt(const char *format, const Args&... args) {
    std::stringstream ss;
    printfmt(ss, format, args...);
    return ss.str();
}